

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_index.cpp
# Opt level: O1

void TransactionalAppendToPK(DuckDB *db,idx_t thread_idx)

{
  _Head_base<0UL,_duckdb::QueryResult_*,_false> _Var1;
  undefined8 uVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined8 *puVar6;
  pointer pQVar7;
  pointer pDVar8;
  long lVar9;
  initializer_list<duckdb::Value> __l;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> result;
  AssertionHandler catchAssertionHandler;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> chunk;
  Connection con;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_120;
  undefined1 local_118 [32];
  ReusableStringStream local_f8;
  AssertionHandler local_d8;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_90;
  StringRef local_88;
  ulong local_78;
  ulong local_70;
  string local_68;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_48;
  
  local_120._M_head_impl = (QueryResult *)0x0;
  duckdb::Connection::Connection((Connection *)&local_68,db);
  local_d8.m_assertionInfo.macroName.m_start = (char *)&local_d8.m_assertionInfo.lineInfo;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"BEGIN TRANSACTION","");
  duckdb::Connection::Query((string *)local_118);
  uVar2 = local_118._0_8_;
  _Var1._M_head_impl = local_120._M_head_impl;
  local_118._0_8_ = (long *)0x0;
  local_120._M_head_impl = (QueryResult *)uVar2;
  if (_Var1._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)_Var1._M_head_impl + 8))();
  }
  if ((long *)local_118._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_118._0_8_ + 8))();
  }
  local_118._0_8_ = (QueryResult *)0x0;
  if ((SourceLineInfo *)local_d8.m_assertionInfo.macroName.m_start !=
      &local_d8.m_assertionInfo.lineInfo) {
    operator_delete(local_d8.m_assertionInfo.macroName.m_start);
  }
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             &local_120);
  cVar3 = duckdb::BaseQueryResult::HasError();
  if (cVar3 != '\0') {
    local_118._0_8_ = "FAIL";
    local_118._8_8_ = 4;
    local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x4f1b52;
    local_f8.m_index = 0x113;
    Catch::AssertionHandler::AssertionHandler
              (&local_d8,(StringRef *)local_118,(SourceLineInfo *)&local_f8,
               (StringRef)ZEXT816(0x504515),Normal);
    local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
    local_f8.m_index = 0;
    local_f8.m_oss = (ostream *)0x0;
    Catch::ReusableStringStream::ReusableStringStream(&local_f8);
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               &local_120);
    puVar6 = (undefined8 *)duckdb::BaseQueryResult::GetError_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_f8.m_oss,(char *)*puVar6,puVar6[1]);
    Catch::ReusableStringStream::str_abi_cxx11_((string *)local_118,&local_f8);
    local_88.m_start = (char *)local_118._0_8_;
    local_88.m_size = local_118._8_8_;
    Catch::AssertionHandler::handleMessage(&local_d8,ExplicitFailure,&local_88);
    if ((QueryResult *)local_118._0_8_ != (QueryResult *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_);
    }
    Catch::ReusableStringStream::~ReusableStringStream(&local_f8);
    Catch::AssertionHandler::complete(&local_d8);
    if (local_d8.m_completed == false) {
      (*(local_d8.m_resultCapture)->_vptr_IResultCapture[0x11])();
    }
  }
  local_d8.m_assertionInfo.macroName.m_start = (char *)&local_d8.m_assertionInfo.lineInfo;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"SELECT COUNT(*) FROM integers WHERE i >= 0","");
  duckdb::Connection::Query((string *)local_118);
  uVar2 = local_118._0_8_;
  _Var1._M_head_impl = local_120._M_head_impl;
  local_118._0_8_ = (long *)0x0;
  local_120._M_head_impl = (QueryResult *)uVar2;
  if (_Var1._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)_Var1._M_head_impl + 8))();
  }
  if ((long *)local_118._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_118._0_8_ + 8))();
  }
  local_118._0_8_ = (QueryResult *)0x0;
  if ((SourceLineInfo *)local_d8.m_assertionInfo.macroName.m_start !=
      &local_d8.m_assertionInfo.lineInfo) {
    operator_delete(local_d8.m_assertionInfo.macroName.m_start);
  }
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             &local_120);
  cVar3 = duckdb::BaseQueryResult::HasError();
  if (cVar3 != '\0') {
    local_118._0_8_ = "FAIL";
    local_118._8_8_ = 4;
    local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x4f1b52;
    local_f8.m_index = 0x119;
    Catch::AssertionHandler::AssertionHandler
              (&local_d8,(StringRef *)local_118,(SourceLineInfo *)&local_f8,
               (StringRef)ZEXT816(0x504515),Normal);
    local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
    local_f8.m_index = 0;
    local_f8.m_oss = (ostream *)0x0;
    Catch::ReusableStringStream::ReusableStringStream(&local_f8);
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               &local_120);
    puVar6 = (undefined8 *)duckdb::BaseQueryResult::GetError_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_f8.m_oss,(char *)*puVar6,puVar6[1]);
    Catch::ReusableStringStream::str_abi_cxx11_((string *)local_118,&local_f8);
    local_88.m_start = (char *)local_118._0_8_;
    local_88.m_size = local_118._8_8_;
    Catch::AssertionHandler::handleMessage(&local_d8,ExplicitFailure,&local_88);
    if ((QueryResult *)local_118._0_8_ != (QueryResult *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_);
    }
    Catch::ReusableStringStream::~ReusableStringStream(&local_f8);
    Catch::AssertionHandler::complete(&local_d8);
    if (local_d8.m_completed == false) {
      (*(local_d8.m_resultCapture)->_vptr_IResultCapture[0x11])();
    }
  }
  pQVar7 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)&local_120);
  (**(code **)(*(long *)pQVar7 + 0x10))(&local_90,pQVar7);
  pDVar8 = duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
           operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *
                      )&local_90);
  duckdb::DataChunk::GetValue((ulong)&local_d8,(ulong)pDVar8);
  iVar5 = duckdb::Value::GetValue<int>();
  duckdb::Value::~Value((Value *)&local_d8);
  local_70 = (ulong)(uint)((int)thread_idx * 1000);
  local_78 = (ulong)(iVar5 + 1);
  lVar9 = 0;
  do {
    local_d8.m_assertionInfo.macroName.m_start = (char *)&local_d8.m_assertionInfo.lineInfo;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"INSERT INTO integers VALUES ($1)","");
    iVar5 = (int)&local_d8;
    duckdb::Connection::Query<int>((Connection *)local_118,&local_68,iVar5);
    uVar2 = local_118._0_8_;
    _Var1._M_head_impl = local_120._M_head_impl;
    local_118._0_8_ = (long *)0x0;
    local_120._M_head_impl = (QueryResult *)uVar2;
    if (_Var1._M_head_impl != (QueryResult *)0x0) {
      (**(code **)(*(long *)_Var1._M_head_impl + 8))();
    }
    if ((long *)local_118._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_118._0_8_ + 8))();
    }
    local_118._0_8_ = (QueryResult *)0x0;
    if ((SourceLineInfo *)local_d8.m_assertionInfo.macroName.m_start !=
        &local_d8.m_assertionInfo.lineInfo) {
      operator_delete(local_d8.m_assertionInfo.macroName.m_start);
    }
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               &local_120);
    cVar3 = duckdb::BaseQueryResult::HasError();
    if (cVar3 != '\0') {
      local_118._0_8_ = "FAIL";
      local_118._8_8_ = 4;
      local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x4f1b52;
      local_f8.m_index = 0x123;
      Catch::AssertionHandler::AssertionHandler
                (&local_d8,(StringRef *)local_118,(SourceLineInfo *)&local_f8,
                 (StringRef)ZEXT816(0x504515),Normal);
      local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
      local_f8.m_index = 0;
      local_f8.m_oss = (ostream *)0x0;
      Catch::ReusableStringStream::ReusableStringStream(&local_f8);
      duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
      operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
                 &local_120);
      puVar6 = (undefined8 *)duckdb::BaseQueryResult::GetError_abi_cxx11_();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_f8.m_oss,(char *)*puVar6,puVar6[1]);
      Catch::ReusableStringStream::str_abi_cxx11_((string *)local_118,&local_f8);
      local_88.m_start = (char *)local_118._0_8_;
      local_88.m_size = local_118._8_8_;
      Catch::AssertionHandler::handleMessage(&local_d8,ExplicitFailure,&local_88);
      if ((QueryResult *)local_118._0_8_ != (QueryResult *)(local_118 + 0x10)) {
        operator_delete((void *)local_118._0_8_);
      }
      Catch::ReusableStringStream::~ReusableStringStream(&local_f8);
      Catch::AssertionHandler::complete(&local_d8);
      if (local_d8.m_completed == false) {
        (*(local_d8.m_resultCapture)->_vptr_IResultCapture[0x11])
                  (local_d8.m_resultCapture,&local_d8);
      }
    }
    local_d8.m_assertionInfo.macroName.m_start = (char *)&local_d8.m_assertionInfo.lineInfo;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"SELECT COUNT(*), COUNT(DISTINCT i) FROM integers WHERE i >= 0",
               "");
    duckdb::Connection::Query((string *)local_118);
    uVar2 = local_118._0_8_;
    _Var1._M_head_impl = local_120._M_head_impl;
    local_118._0_8_ = (long *)0x0;
    local_120._M_head_impl = (QueryResult *)uVar2;
    if (_Var1._M_head_impl != (QueryResult *)0x0) {
      (**(code **)(*(long *)_Var1._M_head_impl + 8))();
    }
    if ((long *)local_118._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_118._0_8_ + 8))();
    }
    local_118._0_8_ = (QueryResult *)0x0;
    if ((SourceLineInfo *)local_d8.m_assertionInfo.macroName.m_start !=
        &local_d8.m_assertionInfo.lineInfo) {
      operator_delete(local_d8.m_assertionInfo.macroName.m_start);
    }
    duckdb::Value::INTEGER(iVar5);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_d8;
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
              (&local_48,__l,(allocator_type *)local_118);
    bVar4 = duckdb::CHECK_COLUMN
                      ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                        *)&local_120,0,(vector<duckdb::Value,_true> *)&local_48);
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_48);
    duckdb::Value::~Value((Value *)&local_d8);
    if (!bVar4) {
      local_118._0_8_ = "FAIL";
      local_118._8_8_ = 4;
      local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x4f1b52;
      local_f8.m_index = 0x129;
      Catch::AssertionHandler::AssertionHandler
                (&local_d8,(StringRef *)local_118,(SourceLineInfo *)&local_f8,
                 (StringRef)ZEXT816(0x504515),Normal);
      local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
      local_f8.m_index = 0;
      local_f8.m_oss = (ostream *)0x0;
      Catch::ReusableStringStream::ReusableStringStream(&local_f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_f8.m_oss,"Incorrect result in TransactionalAppendToPK",0x2b);
      Catch::ReusableStringStream::str_abi_cxx11_((string *)local_118,&local_f8);
      local_88.m_start = (char *)local_118._0_8_;
      local_88.m_size = local_118._8_8_;
      Catch::AssertionHandler::handleMessage(&local_d8,ExplicitFailure,&local_88);
      if ((QueryResult *)local_118._0_8_ != (QueryResult *)(local_118 + 0x10)) {
        operator_delete((void *)local_118._0_8_);
      }
      Catch::ReusableStringStream::~ReusableStringStream(&local_f8);
      Catch::AssertionHandler::complete(&local_d8);
      if (local_d8.m_completed == false) {
        (*(local_d8.m_resultCapture)->_vptr_IResultCapture[0x11])
                  (local_d8.m_resultCapture,&local_d8);
      }
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x32);
  local_d8.m_assertionInfo.macroName.m_start = (char *)&local_d8.m_assertionInfo.lineInfo;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"COMMIT","");
  duckdb::Connection::Query((string *)local_118);
  uVar2 = local_118._0_8_;
  _Var1._M_head_impl = local_120._M_head_impl;
  local_118._0_8_ = (long *)0x0;
  local_120._M_head_impl = (QueryResult *)uVar2;
  if (_Var1._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)_Var1._M_head_impl + 8))();
  }
  if ((long *)local_118._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_118._0_8_ + 8))();
  }
  local_118._0_8_ = (QueryResult *)0x0;
  if ((SourceLineInfo *)local_d8.m_assertionInfo.macroName.m_start !=
      &local_d8.m_assertionInfo.lineInfo) {
    operator_delete(local_d8.m_assertionInfo.macroName.m_start);
  }
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             &local_120);
  cVar3 = duckdb::BaseQueryResult::HasError();
  if (cVar3 != '\0') {
    local_118._0_8_ = "FAIL";
    local_118._8_8_ = 4;
    local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x4f1b52;
    local_f8.m_index = 0x12f;
    Catch::AssertionHandler::AssertionHandler
              (&local_d8,(StringRef *)local_118,(SourceLineInfo *)&local_f8,
               (StringRef)ZEXT816(0x504515),Normal);
    local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
    local_f8.m_index = 0;
    local_f8.m_oss = (ostream *)0x0;
    Catch::ReusableStringStream::ReusableStringStream(&local_f8);
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               &local_120);
    puVar6 = (undefined8 *)duckdb::BaseQueryResult::GetError_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_f8.m_oss,(char *)*puVar6,puVar6[1]);
    Catch::ReusableStringStream::str_abi_cxx11_((string *)local_118,&local_f8);
    local_88.m_start = (char *)local_118._0_8_;
    local_88.m_size = local_118._8_8_;
    Catch::AssertionHandler::handleMessage(&local_d8,ExplicitFailure,&local_88);
    if ((QueryResult *)local_118._0_8_ != (QueryResult *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_);
    }
    Catch::ReusableStringStream::~ReusableStringStream(&local_f8);
    Catch::AssertionHandler::complete(&local_d8);
    if (local_d8.m_completed == false) {
      (*(local_d8.m_resultCapture)->_vptr_IResultCapture[0x11])();
    }
  }
  if (local_90._M_head_impl != (DataChunk *)0x0) {
    duckdb::DataChunk::~DataChunk(local_90._M_head_impl);
    operator_delete(local_90._M_head_impl);
  }
  duckdb::Connection::~Connection((Connection *)&local_68);
  if (local_120._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)local_120._M_head_impl + 8))();
  }
  return;
}

Assistant:

static void TransactionalAppendToPK(DuckDB *db, idx_t thread_idx) {
	duckdb::unique_ptr<QueryResult> result;

	Connection con(*db);
	result = con.Query("BEGIN TRANSACTION");
	if (result->HasError()) {
		FAIL(result->GetError());
	}

	// get the initial count
	result = con.Query("SELECT COUNT(*) FROM integers WHERE i >= 0");
	if (result->HasError()) {
		FAIL(result->GetError());
	}

	auto chunk = result->Fetch();
	auto initial_count = chunk->GetValue(0, 0).GetValue<int32_t>();

	for (idx_t i = 0; i < 50; i++) {

		result = con.Query("INSERT INTO integers VALUES ($1)", (int32_t)(thread_idx * 1000 + i));
		if (result->HasError()) {
			FAIL(result->GetError());
		}

		// check the count
		result = con.Query("SELECT COUNT(*), COUNT(DISTINCT i) FROM integers WHERE i >= 0");
		if (!CHECK_COLUMN(result, 0, {Value::INTEGER(initial_count + i + 1)})) {
			FAIL("Incorrect result in TransactionalAppendToPK");
		}
	}

	result = con.Query("COMMIT");
	if (result->HasError()) {
		FAIL(result->GetError());
	}
}